

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::NetPrivate::NetPrivate(NetPrivate *this,Option *_opt)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::vector
            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)0x191e28);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x191e35);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x191e42);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x191e4f);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x191e5c);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x191e6c);
  std::vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
  ::vector((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
            *)0x191e7c);
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  return;
}

Assistant:

NetPrivate::NetPrivate(Option& _opt)
    : opt(_opt)
{
    local_blob_allocator = 0;
    local_workspace_allocator = 0;

#if NCNN_VULKAN
    vkdev = 0;
    weight_vkallocator = 0;
    weight_staging_vkallocator = 0;
    pipeline_cache = 0;
#endif // NCNN_VULKAN
}